

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O3

FString __thiscall FluidSynthMIDIDevice::GetStats(FluidSynthMIDIDevice *this)

{
  uint uVar1;
  uint uVar2;
  char *__function;
  long in_RSI;
  int maxpoly;
  char *reverb;
  char *chorus;
  uint local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  if ((*(long *)(in_RSI + 0x68) != 0) && (*(long *)(in_RSI + 0x60) != 0)) {
    (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x723dac;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FCriticalSection::Enter((FCriticalSection *)(in_RSI + 8));
    if ((FluidSynthModule.handle == (void *)0x0) ||
       (uVar1 = (*(code *)fluid_synth_get_polyphony.proc.Call)(*(undefined8 *)(in_RSI + 0x68)),
       FluidSynthModule.handle == (void *)0x0)) {
      __function = 
      "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *)>::operator int (*)(fluid_synth_t *)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *)]"
      ;
    }
    else {
      uVar2 = (*(code *)fluid_synth_get_active_voice_count.proc.Call)
                        (*(undefined8 *)(in_RSI + 0x68));
      if (FluidSynthModule.handle == (void *)0x0) {
        __function = 
        "Proto TReqProc<FluidSynthModule, double (*)(fluid_synth_t *)>::operator double (*)(fluid_synth_t *)() const [Module = FluidSynthModule, Proto = double (*)(fluid_synth_t *)]"
        ;
      }
      else {
        local_40 = (*(code *)fluid_synth_get_cpu_load.proc.Call)(*(undefined8 *)(in_RSI + 0x68));
        if ((FluidSynthModule.handle == (void *)0x0) ||
           ((*(code *)fluid_settings_getstr.proc.Call)
                      (*(undefined8 *)(in_RSI + 0x60),"synth.chorus.active",&local_30),
           FluidSynthModule.handle == (void *)0x0)) {
          __function = 
          "Proto TReqProc<FluidSynthModule, int (*)(fluid_settings_t *, const char *, char **)>::operator int (*)(fluid_settings_t *, const char *, char **)() const [Module = FluidSynthModule, Proto = int (*)(fluid_settings_t *, const char *, char **)]"
          ;
        }
        else {
          (*(code *)fluid_settings_getstr.proc.Call)
                    (*(undefined8 *)(in_RSI + 0x60),"synth.reverb.active",&local_38);
          if (FluidSynthModule.handle != (void *)0x0) {
            (*(code *)fluid_settings_getint.proc.Call)
                      (*(undefined8 *)(in_RSI + 0x60),"synth.polyphony",&local_44);
            FCriticalSection::Leave((FCriticalSection *)(in_RSI + 8));
            FString::Format((FString *)this,
                            "Voices: \x1cK%3d\x1c-/\x1cI%3d\x1c-(\x1cG%3d\x1c-)\x1cK%6.2f\x1c-%% CPU   Reverb: \x1cK%3s\x1c- Chorus: \x1cK%3s"
                            ,local_40,(ulong)uVar2,(ulong)uVar1,(ulong)local_44,local_38,local_30);
            return (FString)(char *)this;
          }
          __function = 
          "Proto TReqProc<FluidSynthModule, int (*)(fluid_settings_t *, const char *, int *)>::operator int (*)(fluid_settings_t *, const char *, int *)() const [Module = FluidSynthModule, Proto = int (*)(fluid_settings_t *, const char *, int *)]"
          ;
        }
      }
    }
    __assert_fail("Module.IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                  ,0xd2,__function);
  }
  FString::FString((FString *)this,"FluidSynth is invalid");
  return (FString)(char *)this;
}

Assistant:

FString FluidSynthMIDIDevice::GetStats()
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return "FluidSynth is invalid";
	}
	FString out;

	CritSec.Enter();
	int polyphony = fluid_synth_get_polyphony(FluidSynth);
	int voices = fluid_synth_get_active_voice_count(FluidSynth);
	double load = fluid_synth_get_cpu_load(FluidSynth);
	char *chorus, *reverb;
	int maxpoly;
	fluid_settings_getstr(FluidSettings, "synth.chorus.active", &chorus);
	fluid_settings_getstr(FluidSettings, "synth.reverb.active", &reverb);
	fluid_settings_getint(FluidSettings, "synth.polyphony", &maxpoly);
	CritSec.Leave();

	out.Format("Voices: " TEXTCOLOR_YELLOW "%3d" TEXTCOLOR_NORMAL "/" TEXTCOLOR_ORANGE "%3d" TEXTCOLOR_NORMAL "(" TEXTCOLOR_RED "%3d" TEXTCOLOR_NORMAL ")"
			   TEXTCOLOR_YELLOW "%6.2f" TEXTCOLOR_NORMAL "%% CPU   "
			   "Reverb: " TEXTCOLOR_YELLOW "%3s" TEXTCOLOR_NORMAL
			   " Chorus: " TEXTCOLOR_YELLOW "%3s",
		voices, polyphony, maxpoly, load, reverb, chorus);
	return out;
}